

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2DR(GatherBase *this,bool base_level)

{
  CallLogWrapper *this_00;
  undefined7 in_register_00000031;
  size_type __n;
  uint uVar1;
  uint width;
  int i;
  int level;
  allocator_type local_59;
  GLfloat data [4];
  vector<float,_std::allocator<float>_> pixels;
  
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->tex);
  level = 0;
  width = (int)CONCAT71(in_register_00000031,base_level) * 0x20 + 0x20;
  for (uVar1 = width; uVar1 != 0; uVar1 = uVar1 >> 1) {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level,0x822e,uVar1,uVar1,0,0x1903,0x1406,(void *)0x0);
    level = level + 1;
  }
  __n = 0x400;
  if (base_level) {
    __n = 0x1000;
  }
  data[0] = 1.0;
  std::vector<float,_std::allocator<float>_>::vector(&pixels,__n,data,&local_59);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,0,0,0,width,width,0x1903,0x1406,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glGenerateMipmap(this_00,0xde1);
  data[0] = 0.75;
  data[1] = 0.5;
  data[2] = 0.0;
  data[3] = 0.25;
  uVar1 = (uint)base_level;
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar1,0x16,0x19,2,2,0x1903,0x1406,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar1,0x10,10,1,1,0x1903,0x1406,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar1,0xb,2,1,1,0x1903,0x1406,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar1,0x18,0xd,1,1,0x1903,0x1406,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,uVar1,9,0xe,1,1,0x1903,0x1406,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pixels.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DR(bool base_level = false)
	{
		GLenum		internal_format = GL_R32F;
		GLenum		format			= GL_RED;
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_FLOAT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
		}
		std::vector<GLfloat> pixels(csize * csize, 1.0);
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, tex_type, &pixels[0]);
		glGenerateMipmap(target);

		GLfloat data[4] = { 12. / 16., 8. / 16., 0. / 16., 4. / 16. };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, tex_type, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, tex_type, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	}